

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  pointer puVar6;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  int iVar30;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (this->pval == (uint *)0x0) {
    pvVar5 = this->pvals;
    if (pvVar5 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                    ,0x62c,
                    "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    puVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)puVar6;
    if (lVar18 != 0) {
      pfVar7 = dEdf->v;
      pfVar8 = dEdxi->v;
      uVar2 = (dEdxi->d).bd;
      uVar3 = (dEdxi->d).d[0];
      uVar4 = (dEdxi->d).nd;
      auVar22 = vpbroadcastq_avx512f();
      uVar15 = 0;
      auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        iVar30 = 1;
        if (uVar4 != 0) {
          uVar16 = 0;
          auVar26 = vmovdqa64_avx512f(auVar23);
          do {
            auVar27 = vmovdqa64_avx512f(auVar26);
            auVar26 = vpbroadcastq_avx512f();
            auVar28 = vporq_avx512f(auVar26,auVar24);
            auVar26 = vporq_avx512f(auVar26,auVar25);
            uVar12 = vpcmpuq_avx512f(auVar26,auVar22,2);
            bVar13 = (byte)uVar12;
            uVar12 = vpcmpuq_avx512f(auVar28,auVar22,2);
            bVar14 = (byte)uVar12;
            uVar20 = CONCAT11(bVar14,bVar13);
            auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar16));
            auVar28._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar26._4_4_;
            auVar28._0_4_ = (uint)(bVar13 & 1) * auVar26._0_4_;
            auVar28._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar26._8_4_;
            auVar28._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar26._12_4_;
            auVar28._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar26._16_4_;
            auVar28._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar26._20_4_;
            auVar28._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar26._24_4_;
            auVar28._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar26._28_4_;
            auVar28._32_4_ = (uint)(bVar14 & 1) * auVar26._32_4_;
            auVar28._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar26._36_4_;
            auVar28._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar26._40_4_;
            auVar28._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar26._44_4_;
            auVar28._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar26._48_4_;
            auVar28._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar26._52_4_;
            auVar28._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar26._56_4_;
            auVar28._60_4_ = (uint)(bVar14 >> 7) * auVar26._60_4_;
            auVar26 = vpmulld_avx512f(auVar28,auVar27);
            uVar16 = uVar16 + 0x10;
          } while (((ulong)uVar4 + 0xf & 0xfffffffffffffff0) != uVar16);
          auVar26 = vmovdqa32_avx512f(auVar26);
          auVar29._0_4_ =
               (uint)(bVar13 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar27._0_4_;
          bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar9 * auVar26._4_4_ | (uint)!bVar9 * auVar27._4_4_;
          bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar9 * auVar26._8_4_ | (uint)!bVar9 * auVar27._8_4_;
          bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar9 * auVar26._12_4_ | (uint)!bVar9 * auVar27._12_4_;
          bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar29._16_4_ = (uint)bVar9 * auVar26._16_4_ | (uint)!bVar9 * auVar27._16_4_;
          bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar29._20_4_ = (uint)bVar9 * auVar26._20_4_ | (uint)!bVar9 * auVar27._20_4_;
          bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar29._24_4_ = (uint)bVar9 * auVar26._24_4_ | (uint)!bVar9 * auVar27._24_4_;
          bVar9 = (bool)((byte)(uVar20 >> 7) & 1);
          auVar29._28_4_ = (uint)bVar9 * auVar26._28_4_ | (uint)!bVar9 * auVar27._28_4_;
          auVar29._32_4_ =
               (uint)(bVar14 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar27._32_4_;
          bVar9 = (bool)(bVar14 >> 1 & 1);
          auVar29._36_4_ = (uint)bVar9 * auVar26._36_4_ | (uint)!bVar9 * auVar27._36_4_;
          bVar9 = (bool)(bVar14 >> 2 & 1);
          auVar29._40_4_ = (uint)bVar9 * auVar26._40_4_ | (uint)!bVar9 * auVar27._40_4_;
          bVar9 = (bool)(bVar14 >> 3 & 1);
          auVar29._44_4_ = (uint)bVar9 * auVar26._44_4_ | (uint)!bVar9 * auVar27._44_4_;
          bVar9 = (bool)(bVar14 >> 4 & 1);
          auVar29._48_4_ = (uint)bVar9 * auVar26._48_4_ | (uint)!bVar9 * auVar27._48_4_;
          bVar9 = (bool)(bVar14 >> 5 & 1);
          auVar29._52_4_ = (uint)bVar9 * auVar26._52_4_ | (uint)!bVar9 * auVar27._52_4_;
          bVar9 = (bool)(bVar14 >> 6 & 1);
          auVar29._56_4_ = (uint)bVar9 * auVar26._56_4_ | (uint)!bVar9 * auVar27._56_4_;
          auVar29._60_4_ =
               (uint)(bVar14 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar27._60_4_;
          auVar21 = vextracti64x4_avx512f(auVar29,1);
          auVar26 = vpmulld_avx512f(auVar29,ZEXT3264(auVar21));
          auVar10 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
          auVar11 = vpshufd_avx(auVar10,0xee);
          auVar10 = vpmulld_avx(auVar10,auVar11);
          auVar11 = vpshufd_avx(auVar10,0x55);
          auVar10 = vpmulld_avx(auVar10,auVar11);
          iVar30 = auVar10._0_4_;
        }
        uVar16 = (ulong)(dEdxi->d).d[1];
        if (uVar4 < 2) {
          uVar16 = 1;
        }
        uVar16 = uVar16 * uVar3;
        uVar19 = (ulong)puVar6[uVar15];
        if (uVar16 < uVar19 || uVar16 - uVar19 == 0) goto LAB_001b096e;
        uVar17 = (int)(uVar15 % (ulong)uVar2) * iVar30;
        pfVar8[uVar17 + uVar19] = pfVar7[uVar15] + pfVar8[uVar17 + uVar19];
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (uVar15 < (ulong)(lVar18 >> 2));
    }
  }
  else {
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_50,dEdxi);
    uVar15 = (ulong)*this->pval;
    if (local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar15 == 0 ||
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar15) {
LAB_001b096e:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[uVar15] =
         fVar1 + local_50.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[uVar15];
  }
  return;
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    (*dEdxi)(*pval) += dEdf.v[0];
  } else {
    assert(pvals);
    for(unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.batch_matrix(b)((*pvals)[b]) += dEdf.v[b];
  }
#endif
}